

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double r8vec_length(int dim_num,double *x)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)dim_num;
  if (dim_num < 1) {
    uVar2 = uVar1;
  }
  dVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar3 = dVar3 + x[uVar1] * x[uVar1];
  }
  if (0.0 <= dVar3) {
    return SQRT(dVar3);
  }
  dVar3 = sqrt(dVar3);
  return dVar3;
}

Assistant:

double r8vec_length ( int dim_num, double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_LENGTH returns the Euclidean length of an R8VEC
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    08 August 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int DIM_NUM, the spatial dimension.
//
//    Input, double X[DIM_NUM], the vector.
//
//    Output, double R8VEC_LENGTH, the Euclidean length of the vector.
//
{
  int i;
  double value;

  value = 0.0;
  for ( i = 0; i < dim_num; i++ )
  {
    value = value + pow ( x[i], 2 );
  }
  value = sqrt ( value );

  return value;
}